

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3cgen.cpp
# Opt level: O1

void __thiscall WasmCGen::If(WasmCGen *this)

{
  string local_30;
  
  printf("/*%s*/\n","If");
  w3SourceGenStack::pop_abi_cxx11_(&local_30,&(this->super_w3SourceGen).stack);
  printf("if (%s) {\n",local_30._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

CGEN (If)
{
    printf ("/*%s*/\n", __func__);
    printf ("if (%s) {\n", pop().c_str());
}